

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ez-rpc.c++
# Opt level: O2

void __thiscall
capnp::EzRpcServer::Impl::Impl
          (Impl *this,Client *mainInterface,int socketFd,uint port,ReaderOptions readerOpts)

{
  _Rb_tree_header *p_Var1;
  LowLevelAsyncIoProvider *pLVar2;
  ClientHook *pCVar3;
  ReaderOptions readerOpts_00;
  Own<kj::ConnectionReceiver> OStack_48;
  Own<capnp::EzRpcContext> *local_38;
  
  (this->super_SturdyRefRestorer<capnp::AnyPointer>).super_SturdyRefRestorerBase.
  _vptr_SturdyRefRestorerBase = (_func_int **)&PTR_baseRestore_00672f60;
  (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)&DAT_00672f88;
  pCVar3 = (mainInterface->hook).ptr;
  (this->mainInterface).hook.disposer = (mainInterface->hook).disposer;
  (this->mainInterface).hook.ptr = pCVar3;
  (mainInterface->hook).ptr = (ClientHook *)0x0;
  local_38 = &this->context;
  EzRpcContext::getThreadLocal();
  p_Var1 = &(this->exportMap)._M_t._M_impl.super__Rb_tree_header;
  (this->exportMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->exportMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->exportMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->exportMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->exportMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  kj::Promise<unsigned_int>::Promise((Promise<unsigned_int> *)&OStack_48,port);
  kj::Promise<unsigned_int>::fork((Promise<unsigned_int> *)&this->portPromise);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&OStack_48);
  kj::TaskSet::TaskSet(&this->tasks,&this->super_ErrorHandler);
  pLVar2 = (((this->context).ptr)->ioContext).lowLevelProvider.ptr;
  (*pLVar2->_vptr_LowLevelAsyncIoProvider[5])
            (&OStack_48,pLVar2,(ulong)(uint)socketFd,&(anonymous_namespace)::DUMMY_FILTER,0);
  readerOpts_00._8_8_ = readerOpts._8_8_ & 0xffffffff;
  readerOpts_00.traversalLimitInWords = readerOpts.traversalLimitInWords;
  acceptLoop(this,&OStack_48,readerOpts_00);
  kj::Own<kj::ConnectionReceiver>::dispose(&OStack_48);
  return;
}

Assistant:

Impl(Capability::Client mainInterface, int socketFd, uint port, ReaderOptions readerOpts)
      : mainInterface(kj::mv(mainInterface)),
        context(EzRpcContext::getThreadLocal()),
        portPromise(kj::Promise<uint>(port).fork()),
        tasks(*this) {
    acceptLoop(context->getLowLevelIoProvider().wrapListenSocketFd(socketFd, DUMMY_FILTER),
               readerOpts);
  }